

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O2

string * __thiscall
google::protobuf::internal::StringBlock::AtOffset_abi_cxx11_(StringBlock *this,size_t offset)

{
  string *psVar1;
  size_t local_28 [2];
  unsigned_long local_18;
  
  local_18 = (ulong)this->allocated_size_ - 0x10;
  local_28[0] = offset;
  psVar1 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                     (local_28,&local_18,"offset <= effective_size()");
  if (psVar1 == (string *)0x0) {
    return (string *)((long)&this[1].next_ + offset);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/string_block.h"
             ,0xa2,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

ABSL_ATTRIBUTE_RETURNS_NONNULL inline std::string* StringBlock::AtOffset(
    size_t offset) {
  ABSL_DCHECK_LE(offset, effective_size());
  return reinterpret_cast<std::string*>(reinterpret_cast<char*>(this + 1) +
                                        offset);
}